

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromIvy(Abc_Ntk_t *pNtkOld,Ivy_Man_t *pMan)

{
  Abc_Edge_t AVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Ivy_Obj_t *pIVar4;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar5;
  bool bVar6;
  int local_5c;
  Ivy_Obj_t *pIStack_58;
  int i;
  Ivy_Obj_t *pNode;
  Abc_Obj_t *pFaninNew1;
  Abc_Obj_t *pFaninNew0;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vNodes;
  Ivy_Man_t *pMan_local;
  Abc_Ntk_t *pNtkOld_local;
  
  pNtk_00 = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pAVar3 = Abc_AigConst1(pNtk_00);
  AVar1 = Abc_EdgeFromNode(pAVar3);
  pIVar4 = Ivy_ManConst1(pMan);
  pIVar4->TravId = AVar1;
  for (local_5c = 0; iVar2 = Abc_NtkCiNum(pNtkOld), local_5c < iVar2; local_5c = local_5c + 1) {
    pAVar3 = Abc_NtkCi(pNtkOld,local_5c);
    AVar1 = Abc_EdgeFromNode((pAVar3->field_6).pCopy);
    pIVar4 = Ivy_ManPi(pMan,local_5c);
    pIVar4->TravId = AVar1;
  }
  p = Ivy_ManDfs(pMan);
  local_5c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p);
    bVar6 = false;
    if (local_5c < iVar2) {
      iVar2 = Vec_IntEntry(p,local_5c);
      pIStack_58 = Ivy_ManObj(pMan,iVar2);
      bVar6 = pIStack_58 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pAVar3 = Abc_ObjFanin0Ivy(pNtk_00,pIStack_58);
    iVar2 = Ivy_ObjIsBuf(pIStack_58);
    if (iVar2 == 0) {
      pAVar5 = Abc_ObjFanin1Ivy(pNtk_00,pIStack_58);
      iVar2 = Ivy_ObjIsExor(pIStack_58);
      if (iVar2 == 0) {
        pFaninNew = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar3,pAVar5);
      }
      else {
        pFaninNew = Abc_AigXor((Abc_Aig_t *)pNtk_00->pManFunc,pAVar3,pAVar5);
      }
      AVar1 = Abc_EdgeFromNode(pFaninNew);
      pIStack_58->TravId = AVar1;
    }
    else {
      AVar1 = Abc_EdgeFromNode(pAVar3);
      pIStack_58->TravId = AVar1;
    }
    local_5c = local_5c + 1;
  }
  for (local_5c = 0; iVar2 = Abc_NtkCoNum(pNtkOld), local_5c < iVar2; local_5c = local_5c + 1) {
    pAVar3 = Abc_NtkCo(pNtkOld,local_5c);
    pIVar4 = Ivy_ManPo(pMan,local_5c);
    pAVar5 = Abc_ObjFanin0Ivy(pNtk_00,pIVar4);
    Abc_ObjAddFanin((pAVar3->field_6).pCopy,pAVar5);
  }
  Vec_IntFree(p);
  iVar2 = Abc_NtkCheck(pNtk_00);
  if (iVar2 == 0) {
    fprintf(_stdout,"Abc_NtkFromIvy(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromIvy( Abc_Ntk_t * pNtkOld, Ivy_Man_t * pMan )
{
    Vec_Int_t * vNodes;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pObjNew, * pFaninNew, * pFaninNew0, * pFaninNew1;
    Ivy_Obj_t * pNode;
    int i;
    // perform strashing
    pNtk = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // transfer the pointers to the basic nodes
    Ivy_ManConst1(pMan)->TravId = Abc_EdgeFromNode( Abc_AigConst1(pNtk) );
    Abc_NtkForEachCi( pNtkOld, pObj, i )
        Ivy_ManPi(pMan, i)->TravId = Abc_EdgeFromNode( pObj->pCopy );
    // rebuild the AIG
    vNodes = Ivy_ManDfs( pMan );
    Ivy_ManForEachNodeVec( pMan, vNodes, pNode, i )
    {
        // add the first fanin
        pFaninNew0 = Abc_ObjFanin0Ivy( pNtk, pNode );
        if ( Ivy_ObjIsBuf(pNode) )
        {
            pNode->TravId = Abc_EdgeFromNode( pFaninNew0 );
            continue;
        }
        // add the second fanin
        pFaninNew1 = Abc_ObjFanin1Ivy( pNtk, pNode );
        // create the new node
        if ( Ivy_ObjIsExor(pNode) )
            pObjNew = Abc_AigXor( (Abc_Aig_t *)pNtk->pManFunc, pFaninNew0, pFaninNew1 );
        else
            pObjNew = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pFaninNew0, pFaninNew1 );
        pNode->TravId = Abc_EdgeFromNode( pObjNew );
    }
    // connect the PO nodes
    Abc_NtkForEachCo( pNtkOld, pObj, i )
    {
        pFaninNew = Abc_ObjFanin0Ivy( pNtk, Ivy_ManPo(pMan, i) );
        Abc_ObjAddFanin( pObj->pCopy, pFaninNew );
    }
    Vec_IntFree( vNodes );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkFromIvy(): Network check has failed.\n" );
    return pNtk;
}